

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O0

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiMesh>::~TempArray(TempArray<std::vector,_aiMesh> *this)

{
  aiMesh *this_00;
  bool bVar1;
  reference ppaVar2;
  aiMesh *elem;
  iterator __end0;
  iterator __begin0;
  mywrap *__range3;
  TempArray<std::vector,_aiMesh> *this_local;
  
  __end0 = ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(&this->arr);
  elem = (aiMesh *)::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(&this->arr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                *)&elem);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
              operator*(&__end0);
    this_00 = *ppaVar2;
    if (this_00 != (aiMesh *)0x0) {
      aiMesh::~aiMesh(this_00);
      operator_delete(this_00,0x520);
    }
    __gnu_cxx::__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
    operator++(&__end0);
  }
  ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector(&this->arr);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }